

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStructures.pb.cc
# Opt level: O2

FloatVector * __thiscall CoreML::Specification::FloatVector::New(FloatVector *this,Arena *arena)

{
  FloatVector *this_00;
  
  this_00 = (FloatVector *)operator_new(0x28);
  FloatVector(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::FloatVector>(arena,this_00);
  }
  return this_00;
}

Assistant:

FloatVector* FloatVector::New(::google::protobuf::Arena* arena) const {
  FloatVector* n = new FloatVector;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}